

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureFileCommand.cxx
# Opt level: O2

bool __thiscall
cmConfigureFileCommand::InitialPass
          (cmConfigureFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *in_path;
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  ostream *poVar5;
  ulong uVar6;
  allocator<char> local_1e9;
  string unknown_args;
  string msg;
  string errorMessage;
  
  in_path = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)in_path) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errorMessage,"called with incorrect number of arguments, expected 2",
               (allocator<char> *)&unknown_args);
    cmCommand::SetError(&this->super_cmCommand,&errorMessage);
  }
  else {
    psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    cmsys::SystemTools::CollapseFullPath(&errorMessage,in_path,psVar4);
    psVar4 = &this->InputFile;
    std::__cxx11::string::operator=((string *)psVar4,(string *)&errorMessage);
    std::__cxx11::string::~string((string *)&errorMessage);
    bVar2 = cmsys::SystemTools::FileIsDirectory(psVar4);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorMessage);
      poVar5 = std::operator<<((ostream *)&errorMessage,"input location\n");
      poVar5 = std::operator<<(poVar5,"  ");
      poVar5 = std::operator<<(poVar5,(string *)psVar4);
      poVar5 = std::operator<<(poVar5,"\n");
      std::operator<<(poVar5,"is a directory but a file was expected.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&unknown_args);
      std::__cxx11::string::~string((string *)&unknown_args);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorMessage);
      return false;
    }
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    cmsys::SystemTools::CollapseFullPath(&errorMessage,pbVar1 + 1,psVar4);
    psVar4 = &this->OutputFile;
    std::__cxx11::string::operator=((string *)psVar4,(string *)&errorMessage);
    std::__cxx11::string::~string((string *)&errorMessage);
    bVar2 = cmsys::SystemTools::FileIsDirectory(psVar4);
    if (bVar2) {
      std::__cxx11::string::append((char *)psVar4);
      cmsys::SystemTools::GetFilenameName(&errorMessage,in_path);
      std::__cxx11::string::append((string *)psVar4);
      std::__cxx11::string::~string((string *)&errorMessage);
    }
    bVar2 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,psVar4);
    if (bVar2) {
      errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
      errorMessage._M_string_length = 0;
      errorMessage.field_2._M_local_buf[0] = '\0';
      bVar2 = cmNewLineStyle::ReadFromArguments(&this->NewLineStyle,args,&errorMessage);
      if (bVar2) {
        this->CopyOnly = false;
        this->EscapeQuotes = false;
        unknown_args._M_dataplus._M_p = (pointer)&unknown_args.field_2;
        unknown_args._M_string_length = 0;
        unknown_args.field_2._M_local_buf[0] = '\0';
        this->AtOnly = false;
        for (uVar6 = 2;
            pbVar1 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
            uVar6 < (ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
            uVar6 = (ulong)((int)uVar6 + 1)) {
          bVar2 = std::operator==(pbVar1 + uVar6,"COPYONLY");
          if (bVar2) {
            this->CopyOnly = true;
            bVar2 = cmNewLineStyle::IsValid(&this->NewLineStyle);
            if (bVar2) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&msg,
                         "COPYONLY could not be used in combination with NEWLINE_STYLE",&local_1e9);
              cmCommand::SetError(&this->super_cmCommand,&msg);
              goto LAB_001bcfc9;
            }
          }
          else {
            bVar2 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar6,
                                    "ESCAPE_QUOTES");
            if (bVar2) {
              this->EscapeQuotes = true;
            }
            else {
              bVar2 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar6,"@ONLY");
              if (bVar2) {
                this->AtOnly = true;
              }
              else {
                bVar2 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar6,
                                        "IMMEDIATE");
                if ((((!bVar2) &&
                     (bVar2 = std::operator==((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar6,
                                              "NEWLINE_STYLE"), !bVar2)) &&
                    (bVar2 = std::operator==((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + uVar6,"LF"
                                            ), !bVar2)) &&
                   (((bVar2 = std::operator==((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar6,
                                              "UNIX"), !bVar2 &&
                     (bVar2 = std::operator==((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar6,
                                              "CRLF"), !bVar2)) &&
                    ((bVar2 = std::operator==((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar6,
                                              "WIN32"), !bVar2 &&
                     (bVar2 = std::operator==((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar6,
                                              "DOS"), !bVar2)))))) {
                  std::__cxx11::string::append((char *)&unknown_args);
                  std::__cxx11::string::append((string *)&unknown_args);
                  std::__cxx11::string::append((char *)&unknown_args);
                }
              }
            }
          }
        }
        if (unknown_args._M_string_length != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg,"configure_file called with unknown argument(s):\n",&local_1e9);
          std::__cxx11::string::append((string *)&msg);
          cmMakefile::IssueMessage((this->super_cmCommand).Makefile,AUTHOR_WARNING,&msg);
          std::__cxx11::string::~string((string *)&msg);
        }
        iVar3 = ConfigureFile(this);
        bVar2 = true;
        if (iVar3 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg,"Problem configuring file",&local_1e9);
          cmCommand::SetError(&this->super_cmCommand,&msg);
LAB_001bcfc9:
          std::__cxx11::string::~string((string *)&msg);
          bVar2 = false;
        }
        std::__cxx11::string::~string((string *)&unknown_args);
      }
      else {
        cmCommand::SetError(&this->super_cmCommand,&errorMessage);
        bVar2 = false;
      }
      std::__cxx11::string::~string((string *)&errorMessage);
      return bVar2;
    }
    std::operator+(&unknown_args,"attempted to configure a file: ",psVar4);
    std::operator+(&errorMessage,&unknown_args," into a source directory.");
    std::__cxx11::string::~string((string *)&unknown_args);
    cmCommand::SetError(&this->super_cmCommand,&errorMessage);
    cmSystemTools::s_FatalErrorOccured = true;
  }
  std::__cxx11::string::~string((string *)&errorMessage);
  return false;
}

Assistant:

bool cmConfigureFileCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments, expected 2");
    return false;
  }

  std::string const& inFile = args[0];
  this->InputFile = cmSystemTools::CollapseFullPath(
    inFile, this->Makefile->GetCurrentSourceDirectory());

  // If the input location is a directory, error out.
  if (cmSystemTools::FileIsDirectory(this->InputFile)) {
    std::ostringstream e;
    /* clang-format off */
    e << "input location\n"
      << "  " << this->InputFile << "\n"
      << "is a directory but a file was expected.";
    /* clang-format on */
    this->SetError(e.str());
    return false;
  }

  std::string const& outFile = args[1];
  this->OutputFile = cmSystemTools::CollapseFullPath(
    outFile, this->Makefile->GetCurrentBinaryDirectory());

  // If the output location is already a directory put the file in it.
  if (cmSystemTools::FileIsDirectory(this->OutputFile)) {
    this->OutputFile += "/";
    this->OutputFile += cmSystemTools::GetFilenameName(inFile);
  }

  if (!this->Makefile->CanIWriteThisFile(this->OutputFile)) {
    std::string e = "attempted to configure a file: " + this->OutputFile +
      " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  std::string errorMessage;
  if (!this->NewLineStyle.ReadFromArguments(args, errorMessage)) {
    this->SetError(errorMessage);
    return false;
  }
  this->CopyOnly = false;
  this->EscapeQuotes = false;

  std::string unknown_args;
  this->AtOnly = false;
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (args[i] == "COPYONLY") {
      this->CopyOnly = true;
      if (this->NewLineStyle.IsValid()) {
        this->SetError("COPYONLY could not be used in combination "
                       "with NEWLINE_STYLE");
        return false;
      }
    } else if (args[i] == "ESCAPE_QUOTES") {
      this->EscapeQuotes = true;
    } else if (args[i] == "@ONLY") {
      this->AtOnly = true;
    } else if (args[i] == "IMMEDIATE") {
      /* Ignore legacy option.  */
    } else if (args[i] == "NEWLINE_STYLE" || args[i] == "LF" ||
               args[i] == "UNIX" || args[i] == "CRLF" || args[i] == "WIN32" ||
               args[i] == "DOS") {
      /* Options handled by NewLineStyle member above.  */
    } else {
      unknown_args += " ";
      unknown_args += args[i];
      unknown_args += "\n";
    }
  }
  if (!unknown_args.empty()) {
    std::string msg = "configure_file called with unknown argument(s):\n";
    msg += unknown_args;
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
  }

  if (!this->ConfigureFile()) {
    this->SetError("Problem configuring file");
    return false;
  }

  return true;
}